

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O0

FilterPropagateResult
duckdb::CheckZonemapTemplated<int>
          (BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  bool bVar1;
  FilterPropagateResult FVar2;
  int constant_00;
  int iVar3;
  Value *this;
  BaseStatistics *in_RDX;
  undefined1 in_SIL;
  undefined8 in_RDI;
  FilterPropagateResult prune_result;
  int constant;
  Value *constant_value;
  array_ptr_iterator<duckdb::Value> __end2;
  array_ptr_iterator<duckdb::Value> __begin2;
  array_ptr<duckdb::Value,_true> *__range2;
  int max_value;
  int min_value;
  array_ptr<duckdb::Value,_true> *in_stack_ffffffffffffff90;
  array_ptr_iterator<duckdb::Value> local_68;
  array_ptr_iterator<duckdb::Value> local_50;
  undefined1 *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffdc;
  int max_value_00;
  
  max_value_00 = CONCAT13(in_SIL,in_stack_ffffffffffffffdc);
  constant_00 = NumericStats::GetMinUnsafe<int>((BaseStatistics *)0xb7d024);
  iVar3 = NumericStats::GetMaxUnsafe<int>((BaseStatistics *)0xb7d032);
  local_38 = &stack0xffffffffffffffe8;
  array_ptr<duckdb::Value,_true>::begin(in_stack_ffffffffffffff90);
  array_ptr<duckdb::Value,_true>::end(in_stack_ffffffffffffff90);
  while( true ) {
    bVar1 = array_ptr_iterator<duckdb::Value>::operator!=(&local_50,&local_68);
    if (!bVar1) {
      return FILTER_ALWAYS_FALSE;
    }
    this = array_ptr_iterator<duckdb::Value>::operator*
                     ((array_ptr_iterator<duckdb::Value> *)CONCAT44(iVar3,in_stack_ffffffffffffffd0)
                     );
    Value::GetValueUnsafe<int>(this);
    FVar2 = CheckZonemapTemplated<int>
                      (in_RDX,(ExpressionType)((ulong)in_RDI >> 0x38),(int)in_RDI,max_value_00,
                       constant_00);
    if (FVar2 == NO_PRUNING_POSSIBLE) break;
    if (FVar2 == FILTER_ALWAYS_TRUE) {
      return FILTER_ALWAYS_TRUE;
    }
    array_ptr_iterator<duckdb::Value>::operator++(&local_50);
  }
  return NO_PRUNING_POSSIBLE;
}

Assistant:

FilterPropagateResult CheckZonemapTemplated(const BaseStatistics &stats, ExpressionType comparison_type,
                                            array_ptr<Value> constants) {
	T min_value = NumericStats::GetMinUnsafe<T>(stats);
	T max_value = NumericStats::GetMaxUnsafe<T>(stats);
	for (auto &constant_value : constants) {
		D_ASSERT(constant_value.type() == stats.GetType());
		D_ASSERT(!constant_value.IsNull());
		T constant = constant_value.GetValueUnsafe<T>();
		auto prune_result = CheckZonemapTemplated(stats, comparison_type, min_value, max_value, constant);
		if (prune_result == FilterPropagateResult::NO_PRUNING_POSSIBLE) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
	}
	return FilterPropagateResult::FILTER_ALWAYS_FALSE;
}